

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O3

ClassDeclarationSyntax * __thiscall
slang::parsing::Parser::parseClassDeclaration
          (Parser *this,AttrList attributes,Token virtualOrInterface)

{
  LanguageVersion LVar1;
  SyntaxNode *pSVar2;
  Token name;
  Token semi_00;
  Token virtualOrInterface_00;
  Info *pIVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  SourceLocation SVar7;
  Diagnostic *pDVar8;
  NameSyntax *baseName;
  undefined8 uVar9;
  undefined8 uVar10;
  DefaultExtendsClauseArgSyntax *defaultedArg;
  ArgumentListSyntax *arguments;
  ExtendsClauseSyntax *extendsClause;
  ImplementsClauseSyntax *implementsClause;
  undefined4 extraout_var;
  NamedBlockClauseSyntax *endBlock;
  ClassDeclarationSyntax *pCVar11;
  ulong uVar12;
  char *pcVar13;
  TokenKind keywordKind;
  size_t sVar14;
  byte bVar15;
  bool bVar16;
  Token openParen;
  string_view arg;
  Token classKeyword;
  Token TVar17;
  Token TVar18;
  SourceRange SVar19;
  string_view sVar20;
  Token defaultKeyword;
  MemberSyntax *member;
  Token endClass;
  Token semi;
  SmallVector<slang::syntax::MemberSyntax_*,_8UL> members;
  ClassSpecifierSyntax *local_168;
  MemberSyntax *local_160;
  Info *local_158;
  Info *local_150;
  Info *local_148;
  undefined8 local_140;
  ParameterPortListSyntax *local_138;
  pointer local_130;
  size_t local_128;
  Info *local_120;
  undefined8 local_118;
  ulong local_110;
  Info *local_108;
  Token local_100;
  SyntaxList<slang::syntax::MemberSyntax> local_f0;
  undefined8 local_b8;
  Info *pIStack_b0;
  Token local_a8;
  Token local_98;
  undefined1 local_88 [32];
  size_t local_68;
  pointer local_60;
  __extent_storage<18446744073709551615UL> local_58;
  
  uVar12 = virtualOrInterface._0_8_;
  local_128 = (size_t)attributes._M_extent._M_extent_value;
  local_130 = attributes._M_ptr;
  TVar17 = ParserBase::consume(&this->super_ParserBase);
  local_120 = TVar17.info;
  local_118 = TVar17._0_8_;
  if ((uVar12 & 0xffff) == 200) {
LAB_003b459b:
    local_168 = (ClassSpecifierSyntax *)0x0;
  }
  else {
    TVar17 = ParserBase::peek(&this->super_ParserBase);
    if ((TVar17.kind == StaticKeyword) || (TVar17.kind == AutomaticKeyword)) {
      uVar9 = 0x100410005;
      if ((int)(this->parseOptions).languageVersion < 1) {
        uVar9 = 0;
      }
      ParserBase::skipToken
                (&this->super_ParserBase,(_Optional_base<slang::DiagCode,_true,_true>)SUB86(uVar9,0)
                );
      ParserBase::peek(&this->super_ParserBase);
    }
    local_168 = parseClassSpecifier(this);
    TVar17.info = local_120;
    TVar17.kind = (undefined2)local_118;
    TVar17._2_1_ = local_118._2_1_;
    TVar17.numFlags.raw = local_118._3_1_;
    TVar17.rawLen = local_118._4_4_;
    if (local_168 == (ClassSpecifierSyntax *)0x0) goto LAB_003b459b;
    if (((local_168->keyword).info != (Info *)0x0) && ((local_168->keyword).kind != FinalKeyword)) {
      SVar7 = Token::location(&local_168->keyword);
      pDVar8 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x550005,SVar7);
      sVar20._M_str = "final";
      sVar20._M_len = 5;
      Diagnostic::operator<<(pDVar8,sVar20);
      TVar17.info = local_120;
      TVar17.kind = (undefined2)local_118;
      TVar17._2_1_ = local_118._2_1_;
      TVar17.numFlags.raw = local_118._3_1_;
      TVar17.rawLen = local_118._4_4_;
    }
  }
  local_120 = TVar17.info;
  local_118 = TVar17._0_8_;
  TVar17 = ParserBase::expect(&this->super_ParserBase,Identifier);
  local_148 = TVar17.info;
  local_140 = TVar17._0_8_;
  local_138 = parseParameterPortList(this);
  Token::Token(&local_98);
  iVar6 = (int)(uVar12 & 0xffff);
  local_110 = uVar12;
  local_108 = virtualOrInterface.info;
  if (iVar6 == 200) {
    extendsClause = (ExtendsClauseSyntax *)0x0;
    keywordKind = ExtendsKeyword;
    goto LAB_003b4739;
  }
  bVar4 = ParserBase::peek(&this->super_ParserBase,ExtendsKeyword);
  keywordKind = ImplementsKeyword;
  if (!bVar4) {
    extendsClause = (ExtendsClauseSyntax *)0x0;
    goto LAB_003b4739;
  }
  TVar17 = ParserBase::consume(&this->super_ParserBase);
  baseName = parseName(this);
  bVar4 = ParserBase::peek(&this->super_ParserBase,OpenParenthesis);
  if (bVar4) {
    TVar18 = ParserBase::peek(&this->super_ParserBase,1);
    if (TVar18.kind == DefaultKeyword) {
      TVar18 = ParserBase::consume(&this->super_ParserBase);
      local_150 = TVar18.info;
      uVar9 = TVar18._0_8_;
      TVar18 = ParserBase::consume(&this->super_ParserBase);
      local_158 = TVar18.info;
      uVar10 = TVar18._0_8_;
      local_a8 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
      openParen.info = local_150;
      openParen.kind = (short)uVar9;
      openParen._2_1_ = (char)((ulong)uVar9 >> 0x10);
      openParen.numFlags.raw = (char)((ulong)uVar9 >> 0x18);
      openParen.rawLen = (int)((ulong)uVar9 >> 0x20);
      defaultKeyword.info = local_158;
      defaultKeyword.kind = (short)uVar10;
      defaultKeyword._2_1_ = (char)((ulong)uVar10 >> 0x10);
      defaultKeyword.numFlags.raw = (char)((ulong)uVar10 >> 0x18);
      defaultKeyword.rawLen = (int)((ulong)uVar10 >> 0x20);
      defaultedArg = slang::syntax::SyntaxFactory::defaultExtendsClauseArg
                               (&this->factory,openParen,defaultKeyword,local_a8);
      if ((int)(this->parseOptions).languageVersion < 1) {
        SVar19 = slang::syntax::SyntaxNode::sourceRange(&defaultedArg->super_SyntaxNode);
        pDVar8 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x20001,SVar19);
        LVar1 = (this->parseOptions).languageVersion;
        sVar14 = 9;
        if (LVar1 == Default) {
          pcVar13 = "1800-2017";
        }
        else if (LVar1 == v1800_2023) {
          pcVar13 = "1800-2023";
        }
        else {
          pcVar13 = "";
          sVar14 = 0;
        }
        arg._M_str = pcVar13;
        arg._M_len = sVar14;
        Diagnostic::operator<<(pDVar8,arg);
        goto LAB_003b4709;
      }
      arguments = (ArgumentListSyntax *)0x0;
    }
    else {
      arguments = parseArgumentList(this);
      defaultedArg = (DefaultExtendsClauseArgSyntax *)0x0;
    }
  }
  else {
    defaultedArg = (DefaultExtendsClauseArgSyntax *)0x0;
LAB_003b4709:
    arguments = (ArgumentListSyntax *)0x0;
  }
  extendsClause =
       slang::syntax::SyntaxFactory::extendsClause
                 (&this->factory,TVar17,baseName,arguments,defaultedArg);
LAB_003b4739:
  implementsClause = parseImplementsClause(this,keywordKind,&local_98);
  Token::Token(&local_100);
  local_88._0_8_ = local_88 + 0x18;
  local_88._8_8_ = 0;
  local_88._16_8_ = (SyntaxNode *)0x8;
  bVar4 = false;
  while( true ) {
    TVar17 = ParserBase::peek(&this->super_ParserBase);
    if ((TVar17.kind == EndOfFile) || ((TVar17._0_4_ & 0xffff) == 0x91)) break;
    local_160 = parseClassMember(this,iVar6 == 200,extendsClause != (ExtendsClauseSyntax *)0x0);
    bVar16 = local_160 == (MemberSyntax *)0x0;
    if (bVar16) {
      bVar5 = slang::syntax::SyntaxFacts::isCloseDelimOrKeyword(TVar17.kind);
      if (bVar5) {
        local_f0.super_SyntaxListBase._0_16_ = ParserBase::peek(&this->super_ParserBase);
        SVar19 = Token::range((Token *)&local_f0);
        pDVar8 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xb80005,SVar19);
        local_f0.super_SyntaxListBase._0_16_ = ParserBase::peek(&this->super_ParserBase);
        sVar20 = Token::valueText((Token *)&local_f0);
        Diagnostic::operator<<(pDVar8,sVar20);
        bVar15 = 0;
        if (((this->super_ParserBase).lastPoppedDelims.first.info != (Info *)0x0) &&
           (bVar15 = 0, (this->super_ParserBase).lastPoppedDelims.second.info != (Info *)0x0)) {
          SVar7 = Token::location(&(this->super_ParserBase).lastPoppedDelims.first);
          Diagnostic::addNote(pDVar8,(DiagCode)0xc10005,SVar7);
          SVar7 = Token::location(&(this->super_ParserBase).lastPoppedDelims.second);
          Diagnostic::addNote(pDVar8,(DiagCode)0xc00005,SVar7);
          bVar15 = 0;
        }
      }
      else {
        bVar15 = ~bVar4 & 1;
      }
      ParserBase::skipToken
                (&this->super_ParserBase,
                 (optional<slang::DiagCode>)((uint6)bVar15 << 0x20 | 0x450005));
      bVar4 = bVar16;
    }
    else {
      checkMemberAllowed(this,&local_160->super_SyntaxNode,ClassDeclaration);
      SmallVectorBase<slang::syntax::MemberSyntax*>::
      emplace_back<slang::syntax::MemberSyntax*const&>
                ((SmallVectorBase<slang::syntax::MemberSyntax*> *)local_88,&local_160);
      pSVar2 = this->previewNode;
      this->previewNode = (SyntaxNode *)0x0;
      (local_160->super_SyntaxNode).previewNode = pSVar2;
      bVar4 = bVar16;
    }
  }
  local_100 = ParserBase::expect(&this->super_ParserBase,EndClassKeyword);
  iVar6 = SmallVectorBase<slang::syntax::MemberSyntax_*>::copy
                    ((SmallVectorBase<slang::syntax::MemberSyntax_*> *)local_88,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)local_100.info);
  if ((ClassDeclarationSyntax *)local_88._0_8_ != (ClassDeclarationSyntax *)(local_88 + 0x18)) {
    operator_delete((void *)local_88._0_8_);
  }
  endBlock = parseNamedBlockClause(this);
  uVar9 = local_140;
  pIVar3 = local_148;
  TVar18.info = local_148;
  TVar18.kind = (undefined2)local_140;
  TVar18._2_1_ = local_140._2_1_;
  TVar18.numFlags.raw = local_140._3_1_;
  TVar18.rawLen = local_140._4_4_;
  checkBlockNames(this,TVar18,endBlock);
  uVar10 = local_140;
  local_88._8_4_ = 1;
  local_88._16_8_ = (SyntaxNode *)0x0;
  local_88[0x18] = '\0';
  local_88[0x19] = '\0';
  local_88[0x1a] = '\0';
  local_88[0x1b] = '\0';
  local_88[0x1c] = '\0';
  local_88[0x1d] = '\0';
  local_88[0x1e] = '\0';
  local_88[0x1f] = '\0';
  local_68 = local_128;
  local_60 = local_130;
  local_58._M_extent_value = local_128;
  local_88._0_8_ = &PTR_getChild_005dac60;
  local_b8 = uVar9;
  pIStack_b0 = pIVar3;
  local_f0.super_SyntaxListBase.super_SyntaxNode.kind = 1;
  local_f0.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_f0.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_f0.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005dad50;
  virtualOrInterface_00.info = local_108;
  virtualOrInterface_00.kind = (undefined2)local_110;
  virtualOrInterface_00._2_1_ = local_110._2_1_;
  virtualOrInterface_00.numFlags.raw = local_110._3_1_;
  virtualOrInterface_00.rawLen = local_110._4_4_;
  name.info = pIVar3;
  local_140._0_2_ = (undefined2)uVar9;
  local_140._2_1_ = SUB81(uVar9,2);
  local_140._3_1_ = SUB81(uVar9,3);
  local_140._4_4_ = SUB84(uVar9,4);
  name.kind = (undefined2)local_140;
  name._2_1_ = local_140._2_1_;
  name.numFlags.raw = local_140._3_1_;
  name.rawLen = local_140._4_4_;
  semi_00.info = local_98.info;
  semi_00.kind = local_98.kind;
  semi_00._2_1_ = local_98._2_1_;
  semi_00.numFlags.raw = local_98.numFlags.raw;
  semi_00.rawLen = local_98.rawLen;
  classKeyword.info = local_120;
  classKeyword.kind = (undefined2)local_118;
  classKeyword._2_1_ = local_118._2_1_;
  classKeyword.numFlags.raw = local_118._3_1_;
  classKeyword.rawLen = local_118._4_4_;
  local_140 = uVar10;
  local_f0.super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_ptr =
       (pointer)CONCAT44(extraout_var,iVar6);
  pCVar11 = slang::syntax::SyntaxFactory::classDeclaration
                      (&this->factory,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_88
                       ,virtualOrInterface_00,classKeyword,local_168,name,local_138,extendsClause,
                       implementsClause,semi_00,&local_f0,local_100,endBlock);
  local_88._0_8_ = pCVar11;
  std::
  vector<slang::syntax::ClassDeclarationSyntax_const*,std::allocator<slang::syntax::ClassDeclarationSyntax_const*>>
  ::emplace_back<slang::syntax::ClassDeclarationSyntax_const*>
            ((vector<slang::syntax::ClassDeclarationSyntax_const*,std::allocator<slang::syntax::ClassDeclarationSyntax_const*>>
              *)&(this->meta).classDecls,(ClassDeclarationSyntax **)local_88);
  return pCVar11;
}

Assistant:

ClassDeclarationSyntax& Parser::parseClassDeclaration(AttrList attributes,
                                                      Token virtualOrInterface) {
    auto classKeyword = consume();

    const bool isIfaceClass = virtualOrInterface.kind == TokenKind::InterfaceKeyword;
    ClassSpecifierSyntax* finalSpecifier = nullptr;
    if (!isIfaceClass) {
        auto next = peek();
        if (next.kind == TokenKind::StaticKeyword || next.kind == TokenKind::AutomaticKeyword) {
            // This was allowed in 1800-2017 but did nothing, so silently skip it.
            // It was removed in 1800-2023 so issue an error.
            if (parseOptions.languageVersion < LanguageVersion::v1800_2023)
                skipToken({});
            else
                skipToken(diag::ExpectedIdentifier);
            next = peek();
        }

        finalSpecifier = parseClassSpecifier();
        if (finalSpecifier && finalSpecifier->keyword &&
            finalSpecifier->keyword.kind != TokenKind::FinalKeyword) {
            addDiag(diag::ExpectedToken, finalSpecifier->keyword.location()) << "final"sv;
        }
    }

    auto name = expect(TokenKind::Identifier);
    auto parameterList = parseParameterPortList();

    Token semi;
    ExtendsClauseSyntax* extendsClause = nullptr;
    ImplementsClauseSyntax* implementsClause = nullptr;

    // interface classes treat "extends" as the implements list
    if (isIfaceClass) {
        implementsClause = parseImplementsClause(TokenKind::ExtendsKeyword, semi);
    }
    else {
        if (peek(TokenKind::ExtendsKeyword)) {
            auto extends = consume();
            auto& baseName = parseName();

            ArgumentListSyntax* arguments = nullptr;
            DefaultExtendsClauseArgSyntax* defaultedArg = nullptr;
            if (peek(TokenKind::OpenParenthesis)) {
                if (peek(1).kind == TokenKind::DefaultKeyword) {
                    auto openParen = consume();
                    auto defaultKeyword = consume();
                    defaultedArg = &factory.defaultExtendsClauseArg(
                        openParen, defaultKeyword, expect(TokenKind::CloseParenthesis));

                    if (parseOptions.languageVersion < LanguageVersion::v1800_2023) {
                        addDiag(diag::WrongLanguageVersion, defaultedArg->sourceRange())
                            << toString(parseOptions.languageVersion);
                    }
                }
                else {
                    arguments = &parseArgumentList();
                }
            }

            extendsClause = &factory.extendsClause(extends, baseName, arguments, defaultedArg);
        }
        implementsClause = parseImplementsClause(TokenKind::ImplementsKeyword, semi);
    }

    Token endClass;
    auto members = parseMemberList<MemberSyntax>(
        TokenKind::EndClassKeyword, endClass, SyntaxKind::ClassDeclaration,
        [this, isIfaceClass, extendsClause](SyntaxKind, bool&) {
            return parseClassMember(isIfaceClass, extendsClause != nullptr);
        });

    auto endBlockName = parseNamedBlockClause();
    checkBlockNames(name, endBlockName);

    auto& result = factory.classDeclaration(attributes, virtualOrInterface, classKeyword,
                                            finalSpecifier, name, parameterList, extendsClause,
                                            implementsClause, semi, members, endClass,
                                            endBlockName);
    meta.classDecls.push_back(&result);
    return result;
}